

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t * container_not(container_t *c,uint8_t type,uint8_t *result_type)

{
  undefined1 *puVar1;
  _Bool _Var2;
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  bitset_container_t *pbVar6;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  byte in_SIL;
  container_t *in_RDI;
  container_t *result;
  bitset_container_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  byte local_11;
  container_t *local_10;
  bitset_container_t *local_8;
  
  puVar1 = (undefined1 *)CONCAT71(in_register_00000011,in_DL);
  local_11 = in_SIL;
  local_10 = container_unwrap_shared(in_RDI,&local_11);
  uVar4 = (uint)local_11;
  if (uVar4 == 1) {
    _Var2 = bitset_container_negation
                      ((bitset_container_t *)(ulong)CONCAT14(local_11,in_stack_ffffffffffffffd0),
                       (container_t **)in_stack_ffffffffffffffc8);
    uVar3 = 2;
    if (_Var2) {
      uVar3 = 1;
    }
    *puVar1 = uVar3;
    local_8 = (bitset_container_t *)0x0;
  }
  else if (uVar4 == 2) {
    pbVar6 = bitset_container_create();
    *puVar1 = 1;
    array_container_negation
              ((array_container_t *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    local_8 = pbVar6;
  }
  else {
    iVar5 = run_container_negation
                      ((run_container_t *)(ulong)CONCAT14(local_11,in_stack_ffffffffffffffd0),
                       (container_t **)in_stack_ffffffffffffffc8);
    *puVar1 = (char)iVar5;
    local_8 = (bitset_container_t *)0x0;
  }
  return local_8;
}

Assistant:

static inline container_t *container_not(const container_t *c, uint8_t type,
                                         uint8_t *result_type) {
    c = container_unwrap_shared(c, &type);
    container_t *result = NULL;
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            *result_type =
                bitset_container_negation(const_CAST_bitset(c), &result)
                    ? BITSET_CONTAINER_TYPE
                    : ARRAY_CONTAINER_TYPE;
            return result;
        case ARRAY_CONTAINER_TYPE:
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_container_negation(const_CAST_array(c), CAST_bitset(result));
            return result;
        case RUN_CONTAINER_TYPE:
            *result_type =
                (uint8_t)run_container_negation(const_CAST_run(c), &result);
            return result;

        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return NULL;
}